

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O1

TimerId __thiscall sznet::net::EventLoop::runAfter(EventLoop *this,double delay,TimerCallback *cb)

{
  _Manager_type p_Var1;
  double dVar2;
  int64_t iVar3;
  TimerId TVar4;
  Timestamp local_60;
  Timestamp local_58;
  double local_50;
  _Any_data local_48;
  _Manager_type local_38;
  _Invoker_type local_30;
  
  local_50 = delay;
  local_58 = Timestamp::now();
  dVar2 = local_50 * 1000000.0;
  iVar3 = Timestamp::microSecondsSinceEpoch(&local_58);
  Timestamp::Timestamp(&local_60,(long)dVar2 + iVar3);
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_38 = (_Manager_type)0x0;
  local_30 = cb->_M_invoker;
  p_Var1 = (cb->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_48._M_unused._0_8_ = (undefined8)*(undefined8 *)&(cb->super__Function_base)._M_functor;
    local_48._8_8_ = *(undefined8 *)((long)&(cb->super__Function_base)._M_functor + 8);
    (cb->super__Function_base)._M_manager = (_Manager_type)0x0;
    cb->_M_invoker = (_Invoker_type)0x0;
    local_38 = p_Var1;
  }
  TVar4 = runAt(this,local_60,(TimerCallback *)&local_48);
  if (local_38 != (_Manager_type)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  return TVar4;
}

Assistant:

TimerId EventLoop::runAfter(double delay, TimerCallback cb)
{
	Timestamp time(addTime(Timestamp::now(), delay));
	return runAt(time, std::move(cb));
}